

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  bool bVar1;
  uint depth_00;
  int iVar2;
  Edition EVar3;
  int iVar4;
  MessageOptions *pMVar5;
  FileDescriptor *pFVar6;
  DescriptorPool *pDVar7;
  FieldDescriptor *pFVar8;
  Descriptor *pDVar9;
  EnumDescriptor *this_00;
  OneofDescriptor *pOVar10;
  FieldDescriptor *pFVar11;
  ExtensionRange *pEVar12;
  ExtensionRangeOptions *from;
  long lVar13;
  SymbolVisibility *visibility;
  char *__str;
  Arg *a1;
  string_view sVar14;
  string_view src;
  Arg *in_stack_fffffffffffff4e8;
  Arg local_808;
  string_view local_7d8;
  string_view local_7c8;
  string local_7b8;
  Arg local_798;
  string_view local_768;
  int local_754;
  undefined1 local_750 [4];
  int i_8;
  string_view local_720;
  Arg local_710;
  Arg local_6e0;
  string_view local_6b0;
  Arg local_6a0;
  string_view local_670;
  Arg local_660;
  string_view local_630;
  ReservedRange *local_620;
  ReservedRange *range;
  undefined1 local_610 [4];
  int i_7;
  string_view local_5e0;
  Arg local_5d0;
  string_view local_5a0;
  string_view local_590;
  Arg local_580;
  Arg local_550;
  string_view local_520;
  Arg local_510;
  string_view local_4e0;
  int local_4cc;
  Descriptor *pDStack_4c8;
  int i_6;
  Descriptor *containing_type;
  AlphaNum local_490;
  AlphaNum local_460;
  AlphaNum local_430;
  undefined1 local_400 [8];
  string formatted_options;
  ExtensionRangeOptions range_options;
  string_view local_340;
  Arg local_330;
  Arg local_300;
  string_view local_2d0;
  int local_2bc;
  int local_2b8;
  int i_5;
  int i_4;
  int i_3;
  int local_2a4;
  undefined1 local_2a0 [4];
  int i_2;
  Descriptor *local_288;
  int local_27c;
  undefined1 local_278 [4];
  int i_1;
  Descriptor *local_260;
  int local_254;
  undefined1 local_250 [4];
  int i;
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  MessageOptions full_options;
  Arg local_1c8;
  SymbolVisibility local_194;
  string local_190;
  Arg local_170;
  Arg local_140;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  undefined1 local_100 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string prefix;
  bool include_opening_clause_local;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  Descriptor *this_local;
  
  prefix.field_2._M_local_buf[0xf] = include_opening_clause;
  pMVar5 = options(this);
  bVar1 = MessageOptions::map_entry(pMVar5);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,(long)(depth * 2),' ',&local_51);
    std::allocator<char>::~allocator(&local_51);
    depth_00 = depth + 1;
    anon_unknown_24::SourceLocationCommentPrinter::
    SourceLocationCommentPrinter<google::protobuf::Descriptor>
              ((SourceLocationCommentPrinter *)local_100,this,(string *)local_50,
               debug_string_options);
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)local_100,contents);
    if ((prefix.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,"$0$1message $2");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      local_194 = visibility_keyword(this);
      protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
                (&local_190,(_anonymous_namespace_ *)&local_194,visibility);
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_170,&local_190)
      ;
      sVar14 = name(this);
      absl::lts_20250127::substitute_internal::Arg::Arg(&local_1c8,sVar14);
      sVar14._M_str = (char *)&local_140;
      sVar14._M_len = (size_t)local_110._M_str;
      absl::lts_20250127::SubstituteAndAppend
                ((lts_20250127 *)contents,(Nonnull<std::string_*>)local_110._M_len,sVar14,&local_170
                 ,&local_1c8,in_stack_fffffffffffff4e8);
      std::__cxx11::string::~string((string *)&local_190);
    }
    std::__cxx11::string::append((char *)contents);
    pMVar5 = options(this);
    MessageOptions::MessageOptions
              ((MessageOptions *)
               ((long)&groups.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8),pMVar5);
    anon_unknown_24::CopyFeaturesToOptions<google::protobuf::MessageOptions>
              (this->proto_features_,
               (MessageOptions *)
               ((long)&groups.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    pFVar6 = file(this);
    pDVar7 = FileDescriptor::pool(pFVar6);
    anon_unknown_24::FormatLineOptions
              (depth_00,(Message *)
                        ((long)&groups.
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                .settings_.
                                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8),pDVar7,contents);
    absl::lts_20250127::
    flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::flat_hash_set((flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)local_250);
    for (local_254 = 0; iVar4 = local_254, iVar2 = field_count(this), iVar4 < iVar2;
        local_254 = local_254 + 1) {
      pFVar6 = file(this);
      EVar3 = FileDescriptor::edition(pFVar6);
      pFVar8 = field(this,local_254);
      bVar1 = anon_unknown_24::IsGroupSyntax(EVar3,pFVar8);
      if (bVar1) {
        pFVar8 = field(this,local_254);
        local_260 = FieldDescriptor::message_type(pFVar8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                  *)local_278,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)local_250,&local_260);
      }
    }
    for (local_27c = 0; iVar4 = local_27c, iVar2 = extension_count(this), iVar4 < iVar2;
        local_27c = local_27c + 1) {
      pFVar6 = file(this);
      EVar3 = FileDescriptor::edition(pFVar6);
      pFVar8 = extension(this,local_27c);
      bVar1 = anon_unknown_24::IsGroupSyntax(EVar3,pFVar8);
      if (bVar1) {
        pFVar8 = extension(this,local_27c);
        local_288 = FieldDescriptor::message_type(pFVar8);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::insert((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                  *)local_2a0,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)local_250,&local_288);
      }
    }
    for (local_2a4 = 0; iVar4 = local_2a4, iVar2 = nested_type_count(this), iVar4 < iVar2;
        local_2a4 = local_2a4 + 1) {
      _i_4 = nested_type(this,local_2a4);
      bVar1 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
              ::contains<google::protobuf::Descriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                          *)local_250,(key_arg<const_google::protobuf::Descriptor_*> *)&i_4);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar9 = nested_type(this,local_2a4);
        DebugString(pDVar9,depth_00,contents,debug_string_options,true);
      }
    }
    for (i_5 = 0; iVar4 = i_5, iVar2 = enum_type_count(this), iVar4 < iVar2; i_5 = i_5 + 1) {
      this_00 = enum_type(this,i_5);
      EnumDescriptor::DebugString(this_00,depth_00,contents,debug_string_options);
    }
    for (local_2b8 = 0; iVar4 = local_2b8, iVar2 = field_count(this), iVar4 < iVar2;
        local_2b8 = local_2b8 + 1) {
      pFVar8 = field(this,local_2b8);
      pOVar10 = FieldDescriptor::real_containing_oneof(pFVar8);
      if (pOVar10 == (OneofDescriptor *)0x0) {
        pFVar8 = field(this,local_2b8);
        FieldDescriptor::DebugString(pFVar8,depth_00,contents,debug_string_options);
      }
      else {
        pFVar8 = field(this,local_2b8);
        pOVar10 = FieldDescriptor::containing_oneof(pFVar8);
        pFVar8 = OneofDescriptor::field(pOVar10,0);
        pFVar11 = field(this,local_2b8);
        if (pFVar8 == pFVar11) {
          pFVar8 = field(this,local_2b8);
          pOVar10 = FieldDescriptor::containing_oneof(pFVar8);
          OneofDescriptor::DebugString(pOVar10,depth_00,contents,debug_string_options);
        }
      }
    }
    local_2bc = 0;
    while( true ) {
      iVar4 = local_2bc;
      iVar2 = extension_range_count(this);
      if (iVar2 <= iVar4) break;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2d0,"$0  extensions $1");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_300,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      pEVar12 = extension_range(this,local_2bc);
      iVar4 = ExtensionRange::start_number(pEVar12);
      absl::lts_20250127::substitute_internal::Arg::Arg(&local_330,iVar4);
      a1 = &local_330;
      absl::lts_20250127::SubstituteAndAppend(contents,local_2d0,&local_300,a1);
      pEVar12 = extension_range(this,local_2bc);
      iVar4 = ExtensionRange::end_number(pEVar12);
      pEVar12 = extension_range(this,local_2bc);
      iVar2 = ExtensionRange::start_number(pEVar12);
      if (iVar2 + 1 < iVar4) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_340," to $0");
        pEVar12 = extension_range(this,local_2bc);
        iVar4 = ExtensionRange::end_number(pEVar12);
        absl::lts_20250127::substitute_internal::Arg::Arg
                  ((Arg *)((long)&range_options.field_0 + 0x58),iVar4 + -1);
        absl::lts_20250127::SubstituteAndAppend
                  (contents,local_340,(Arg *)((long)&range_options.field_0 + 0x58));
      }
      pEVar12 = extension_range(this,local_2bc);
      from = ExtensionRange::options(pEVar12);
      ExtensionRangeOptions::ExtensionRangeOptions
                ((ExtensionRangeOptions *)((long)&formatted_options.field_2 + 8),from);
      pEVar12 = extension_range(this,local_2bc);
      anon_unknown_24::CopyFeaturesToOptions<google::protobuf::ExtensionRangeOptions>
                (pEVar12->proto_features_,
                 (ExtensionRangeOptions *)((long)&formatted_options.field_2 + 8));
      std::__cxx11::string::string((string *)local_400);
      pFVar6 = file(this);
      pDVar7 = FileDescriptor::pool(pFVar6);
      bVar1 = anon_unknown_24::FormatBracketedOptions
                        ((anon_unknown_24 *)(ulong)depth_00,(int)&formatted_options + 0x18,
                         (Message *)pDVar7,(DescriptorPool *)local_400,(string *)a1);
      if (bVar1) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_430," [");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_490,"]");
        absl::lts_20250127::StrAppend(contents,&local_430,&local_460,&local_490);
      }
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&containing_type,";\n");
      absl::lts_20250127::StrAppend(contents,(AlphaNum *)&containing_type);
      std::__cxx11::string::~string((string *)local_400);
      ExtensionRangeOptions::~ExtensionRangeOptions
                ((ExtensionRangeOptions *)((long)&formatted_options.field_2 + 8));
      local_2bc = local_2bc + 1;
    }
    pDStack_4c8 = (Descriptor *)0x0;
    local_4cc = 0;
    while( true ) {
      iVar4 = local_4cc;
      iVar2 = extension_count(this);
      if (iVar2 <= iVar4) break;
      pFVar8 = extension(this,local_4cc);
      pDVar9 = FieldDescriptor::containing_type(pFVar8);
      if (pDVar9 != pDStack_4c8) {
        if (0 < local_4cc) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_4e0,"$0  }\n");
          absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                    (&local_510,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
          absl::lts_20250127::SubstituteAndAppend(contents,local_4e0,&local_510);
        }
        pFVar8 = extension(this,local_4cc);
        pDStack_4c8 = FieldDescriptor::containing_type(pFVar8);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_520,"$0  extend .$1 {\n");
        absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                  (&local_550,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        sVar14 = full_name(pDStack_4c8);
        local_590 = sVar14;
        absl::lts_20250127::substitute_internal::Arg::Arg(&local_580,sVar14);
        absl::lts_20250127::SubstituteAndAppend(contents,local_520,&local_550,&local_580);
      }
      pFVar8 = extension(this,local_4cc);
      FieldDescriptor::DebugString(pFVar8,depth + 2,contents,debug_string_options);
      local_4cc = local_4cc + 1;
    }
    iVar4 = extension_count(this);
    if (0 < iVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5a0,"$0  }\n")
      ;
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                (&local_5d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::SubstituteAndAppend(contents,local_5a0,&local_5d0);
    }
    iVar4 = reserved_range_count(this);
    if (0 < iVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_5e0,"$0  reserved ");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                ((Arg *)local_610,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::SubstituteAndAppend(contents,local_5e0,(Arg *)local_610);
      range._4_4_ = 0;
      while( true ) {
        iVar4 = range._4_4_;
        iVar2 = reserved_range_count(this);
        if (iVar2 <= iVar4) break;
        local_620 = reserved_range(this,range._4_4_);
        if (local_620->end == local_620->start + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_630,"$0, ");
          absl::lts_20250127::substitute_internal::Arg::Arg(&local_660,local_620->start);
          absl::lts_20250127::SubstituteAndAppend(contents,local_630,&local_660);
        }
        else if (local_620->end < 0x20000000) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_6b0,"$0 to $1, ");
          absl::lts_20250127::substitute_internal::Arg::Arg(&local_6e0,local_620->start);
          absl::lts_20250127::substitute_internal::Arg::Arg(&local_710,local_620->end + -1);
          absl::lts_20250127::SubstituteAndAppend(contents,local_6b0,&local_6e0,&local_710);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_670,"$0 to max, ");
          absl::lts_20250127::substitute_internal::Arg::Arg(&local_6a0,local_620->start);
          absl::lts_20250127::SubstituteAndAppend(contents,local_670,&local_6a0);
        }
        range._4_4_ = range._4_4_ + 1;
      }
      lVar13 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)contents,lVar13 - 2,(char *)0x2);
    }
    iVar4 = reserved_name_count(this);
    if (0 < iVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_720,"$0  reserved ");
      absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                ((Arg *)local_750,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      absl::lts_20250127::SubstituteAndAppend(contents,local_720,(Arg *)local_750);
      local_754 = 0;
      while( true ) {
        iVar4 = local_754;
        iVar2 = reserved_name_count(this);
        if (iVar2 <= iVar4) break;
        pFVar6 = file(this);
        EVar3 = FileDescriptor::edition(pFVar6);
        __str = "$0, ";
        if ((int)EVar3 < 1000) {
          __str = "\"$0\", ";
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_768,__str);
        sVar14 = reserved_name(this,local_754);
        src._M_len = sVar14._M_str;
        src._M_str = (char *)sVar14._M_len;
        local_7c8 = sVar14;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_7b8,(lts_20250127 *)sVar14._M_len,src);
        absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
                  (&local_798,&local_7b8);
        absl::lts_20250127::SubstituteAndAppend(contents,local_768,&local_798);
        std::__cxx11::string::~string((string *)&local_7b8);
        local_754 = local_754 + 1;
      }
      lVar13 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)contents,lVar13 - 2,(char *)0x2);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d8,"$0}\n");
    absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
              (&local_808,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    absl::lts_20250127::SubstituteAndAppend(contents,local_7d8,&local_808);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)local_100,contents);
    absl::lts_20250127::
    flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~flat_hash_set((flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_250);
    MessageOptions::~MessageOptions
              ((MessageOptions *)
               ((long)&groups.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_ + 8));
    anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)local_100);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    absl::SubstituteAndAppend(contents, "$0$1message $2", prefix,
                              VisibilityToKeyword(visibility_keyword()),
                              name());
  }
  contents->append(" {\n");

  MessageOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (IsGroupSyntax(file()->edition(), field(i))) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(file()->edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (!groups.contains(nested_type(i))) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    absl::SubstituteAndAppend(contents, "$0  extensions $1", prefix,
                              extension_range(i)->start_number());
    if (extension_range(i)->end_number() >
        extension_range(i)->start_number() + 1) {
      absl::SubstituteAndAppend(contents, " to $0",
                                extension_range(i)->end_number() - 1);
    }
    ExtensionRangeOptions range_options = extension_range(i)->options();
    CopyFeaturesToOptions(extension_range(i)->proto_features_, &range_options);
    std::string formatted_options;
    if (FormatBracketedOptions(depth, range_options, file()->pool(),
                               &formatted_options)) {
      absl::StrAppend(contents, " [", formatted_options, "]");
    }
    absl::StrAppend(contents, ";\n");
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) absl::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    absl::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}